

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O1

bool __thiscall
ON_3dmUnitsAndTolerances::Write(ON_3dmUnitsAndTolerances *this,ON_BinaryArchive *file)

{
  LengthUnitSystem u0;
  bool bVar1;
  ON_wString *s;
  uint i;
  double x;
  
  bVar1 = ON_BinaryArchive::WriteInt(file,0x66);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)(this->m_unit_system).m_unit_system);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_absolute_tolerance);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_angle_tolerance);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_relative_tolerance);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_distance_display_mode);
  }
  i = this->m_distance_display_precision;
  if (0x14 < i) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_3dm_settings.cpp"
               ,0x28e,"",
               "ON_3dmUnitsAndTolerances::Write() - m_distance_display_precision out of range.");
    i = 3;
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::WriteInt(file,i);
  }
  if (bVar1 != false) {
    u0 = (this->m_unit_system).m_unit_system;
    if (u0 == None) {
      x = 1.0;
    }
    else {
      x = ON_DBL_QNAN;
      if (u0 != Unset) {
        if (u0 == CustomUnits) {
          x = (this->m_unit_system).m_meters_per_custom_unit;
        }
        else {
          x = ON::UnitScale(u0,Meters);
        }
      }
    }
    bVar1 = ON_BinaryArchive::WriteDouble(file,x);
  }
  if (bVar1 == false) {
    return false;
  }
  if ((this->m_unit_system).m_unit_system == CustomUnits) {
    s = ON_UnitSystem::UnitSystemName(&this->m_unit_system);
  }
  else {
    s = &ON_wString::EmptyString;
  }
  bVar1 = ON_BinaryArchive::WriteString(file,s);
  return bVar1;
}

Assistant:

bool ON_3dmUnitsAndTolerances::Write( ON_BinaryArchive& file ) const
{
  const int version = 102;
  unsigned int i;

  // version 100 ON_3dmUnitsAndTolerances settings
  bool rc = file.WriteInt( version );
  i = static_cast<unsigned int>(m_unit_system.UnitSystem());
  if ( rc ) rc = file.WriteInt( i );
  if ( rc ) rc = file.WriteDouble( m_absolute_tolerance );
  if ( rc ) rc = file.WriteDouble( m_angle_tolerance );
  if ( rc ) rc = file.WriteDouble( m_relative_tolerance );

  // added in version 101
  i = static_cast<unsigned int>(m_distance_display_mode);
  if ( rc ) rc = file.WriteInt( i );
  i = m_distance_display_precision;
  if ( i > 20 ) 
  {
    ON_ERROR("ON_3dmUnitsAndTolerances::Write() - m_distance_display_precision out of range.");
    i = 3;
  }
  if ( rc ) rc = file.WriteInt( i );

  // added in version 102
  if ( rc ) rc = file.WriteDouble( m_unit_system.MetersPerUnit(ON_DBL_QNAN));
  if ( rc ) rc = file.WriteString( (ON::LengthUnitSystem::CustomUnits == m_unit_system.UnitSystem() ? m_unit_system.UnitSystemName() : ON_wString::EmptyString) );
  return rc;
}